

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto::SerializeWithCachedSizes
          (DescriptorProto *this,CodedOutputStream *output)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int size;
  char *pcVar4;
  string *psVar5;
  FieldDescriptorProto *pFVar6;
  DescriptorProto *value;
  EnumDescriptorProto *value_00;
  DescriptorProto_ExtensionRange *value_01;
  OneofDescriptorProto *value_02;
  DescriptorProto_ReservedRange *value_03;
  UnknownFieldSet *unknown_fields;
  int local_78;
  int n_7;
  int i_7;
  uint n_6;
  uint i_6;
  uint n_5;
  uint i_5;
  uint n_4;
  uint i_4;
  uint n_3;
  uint i_3;
  uint n_2;
  uint i_2;
  uint n_1;
  uint i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  DescriptorProto *this_local;
  
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar1 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar1,SERIALIZE,"google.protobuf.DescriptorProto.name");
    psVar5 = name_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(1,psVar5,output);
  }
  i_1 = 0;
  uVar2 = field_size(this);
  for (; i_1 < uVar2; i_1 = i_1 + 1) {
    pFVar6 = field(this,i_1);
    internal::WireFormatLite::WriteMessageMaybeToArray(2,(MessageLite *)pFVar6,output);
  }
  i_2 = 0;
  uVar2 = nested_type_size(this);
  for (; i_2 < uVar2; i_2 = i_2 + 1) {
    value = nested_type(this,i_2);
    internal::WireFormatLite::WriteMessageMaybeToArray(3,(MessageLite *)value,output);
  }
  i_3 = 0;
  uVar2 = enum_type_size(this);
  for (; i_3 < uVar2; i_3 = i_3 + 1) {
    value_00 = enum_type(this,i_3);
    internal::WireFormatLite::WriteMessageMaybeToArray(4,(MessageLite *)value_00,output);
  }
  i_4 = 0;
  uVar2 = extension_range_size(this);
  for (; i_4 < uVar2; i_4 = i_4 + 1) {
    value_01 = extension_range(this,i_4);
    internal::WireFormatLite::WriteMessageMaybeToArray(5,(MessageLite *)value_01,output);
  }
  i_5 = 0;
  uVar2 = extension_size(this);
  for (; i_5 < uVar2; i_5 = i_5 + 1) {
    pFVar6 = extension(this,i_5);
    internal::WireFormatLite::WriteMessageMaybeToArray(6,(MessageLite *)pFVar6,output);
  }
  if ((uVar3 & 2) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray(7,(MessageLite *)this->options_,output);
  }
  i_6 = 0;
  uVar3 = oneof_decl_size(this);
  for (; i_6 < uVar3; i_6 = i_6 + 1) {
    value_02 = oneof_decl(this,i_6);
    internal::WireFormatLite::WriteMessageMaybeToArray(8,(MessageLite *)value_02,output);
  }
  i_7 = 0;
  uVar3 = reserved_range_size(this);
  for (; (uint)i_7 < uVar3; i_7 = i_7 + 1) {
    value_03 = reserved_range(this,i_7);
    internal::WireFormatLite::WriteMessageMaybeToArray(9,(MessageLite *)value_03,output);
  }
  local_78 = 0;
  iVar1 = reserved_name_size(this);
  for (; local_78 < iVar1; local_78 = local_78 + 1) {
    reserved_name_abi_cxx11_(this,local_78);
    pcVar4 = (char *)std::__cxx11::string::data();
    reserved_name_abi_cxx11_(this,local_78);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,size,SERIALIZE,"google.protobuf.DescriptorProto.reserved_name");
    psVar5 = reserved_name_abi_cxx11_(this,local_78);
    internal::WireFormatLite::WriteString(10,psVar5,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = DescriptorProto::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void DescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.DescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned int i = 0, n = this->field_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      2, this->field(i), output);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned int i = 0, n = this->nested_type_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      3, this->nested_type(i), output);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned int i = 0, n = this->enum_type_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, this->enum_type(i), output);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned int i = 0, n = this->extension_range_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, this->extension_range(i), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned int i = 0, n = this->extension_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->extension(i), output);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, *this->options_, output);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned int i = 0, n = this->oneof_decl_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, this->oneof_decl(i), output);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned int i = 0, n = this->reserved_range_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      9, this->reserved_range(i), output);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this->reserved_name_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->reserved_name(i).data(), this->reserved_name(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.reserved_name");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      10, this->reserved_name(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.DescriptorProto)
}